

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::initTest(TextureCubeMapArrayGetterCalls *this)

{
  PNamesMap *pPVar1;
  PNamesVec *this_00;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  NotSupportedError *this_01;
  string local_50;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    pPVar1 = &this->pnames_for_gettexparameter_default;
    local_50._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 1000;
    local_50._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2702;
    local_50._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2601;
    local_50._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = -1000;
    local_50._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 1000;
    local_50._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1903;
    local_50._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1904;
    local_50._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1905;
    local_50._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1906;
    local_50._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2901;
    local_50._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2901;
    local_50._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2901;
    pPVar1 = &this->pnames_for_gettexparameter_modified;
    local_50._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 1;
    local_50._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 1;
    local_50._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2600;
    local_50._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x2600;
    local_50._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = -10;
    local_50._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 10;
    local_50._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1904;
    local_50._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1905;
    local_50._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1906;
    local_50._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x1903;
    local_50._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x812f;
    local_50._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x8370;
    local_50._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar3 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar3 = 0x812f;
    this_00 = &this->pnames_for_gettexlevelparameter;
    local_50._M_dataplus._M_p._0_4_ = 0x86a1;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x86a1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805f;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x805f;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805e;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x805e;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805d;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x805d;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805c;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x805c;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x884a;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x884a;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c3f;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c3f;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x88f1;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x88f1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c13;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c13;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c12;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c12;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c11;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c11;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c10;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c10;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c16;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8c16;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1003;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x1003;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1000;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x1000;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1001;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x1001;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8071;
    iVar2._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pnames_for_gettexlevelparameter).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar2,(uint *)&local_50);
    }
    else {
      *iVar2._M_current = 0x8071;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Texture cube map array functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGetterCalls::initTest(void)
{
	/* Only execute if GL_EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}

	pnames_for_gettexparameter_default[GL_TEXTURE_BASE_LEVEL] = 0;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LEVEL]  = 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_FILTER] = GL_NEAREST_MIPMAP_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAG_FILTER] = GL_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_LOD]	= -1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LOD]	= 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_R]  = GL_RED;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_G]  = GL_GREEN;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_B]  = GL_BLUE;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_A]  = GL_ALPHA;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_S]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_T]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_R]	 = GL_REPEAT;

	pnames_for_gettexparameter_modified[GL_TEXTURE_BASE_LEVEL] = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LEVEL]  = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAG_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_LOD]	= -10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LOD]	= 10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_R]  = GL_GREEN;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_G]  = GL_BLUE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_B]  = GL_ALPHA;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_A]  = GL_RED;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_S]	 = GL_CLAMP_TO_EDGE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_T]	 = GL_MIRRORED_REPEAT;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_R]	 = GL_CLAMP_TO_EDGE;

	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_COMPRESSED);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_SHARED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_STENCIL_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_INTERNAL_FORMAT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_WIDTH);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_HEIGHT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH);
}